

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O3

QDebug operator<<(QDebug *debug,QStyleOption *option)

{
  Stream *pSVar1;
  Stream *in_RDI;
  
  pSVar1 = debug->stream;
  debug->stream = (Stream *)0x0;
  *(Stream **)in_RDI = pSVar1;
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug debug, const QStyleOption &option)
{
#if !defined(QT_NO_DEBUG)
    debug << "QStyleOption(";
    debug << QStyleOption::OptionType(option.type);
    debug << ',' << (option.direction == Qt::RightToLeft ? "RightToLeft" : "LeftToRight");
    debug << ',' << option.state;
    debug << ',' << option.rect;
    debug << ',' << option.styleObject;
    debug << ')';
#else
    Q_UNUSED(option);
#endif
    return debug;
}